

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::MasteringMetadata::Write(MasteringMetadata *this,IMkvWriter *writer)

{
  float fVar1;
  uint64_t type;
  IMkvWriter *in_RSI;
  IMkvWriter *in_RDI;
  uint64_t size;
  MasteringMetadata *in_stack_ffffffffffffffe0;
  IMkvWriter *writer_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  writer_00 = in_RDI;
  type = PayloadSize(in_stack_ffffffffffffffe0);
  if (type == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = WriteEbmlMasterElement(in_RSI,type,(uint64)in_RDI);
    if (bVar2) {
      if (((*(float *)&in_RDI->_vptr_IMkvWriter == 3.4028235e+38) &&
          (!NAN(*(float *)&in_RDI->_vptr_IMkvWriter))) ||
         (bVar2 = WriteEbmlElement(in_RSI,type,(float)((ulong)in_RDI >> 0x20)), bVar2)) {
        fVar1 = *(float *)((long)&in_RDI->_vptr_IMkvWriter + 4);
        if (((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) ||
           (bVar2 = WriteEbmlElement(in_RSI,type,(float)((ulong)in_RDI >> 0x20)), bVar2)) {
          if ((in_RDI[1]._vptr_IMkvWriter == (_func_int **)0x0) ||
             (bVar2 = PrimaryChromaticity::Write
                                ((PrimaryChromaticity *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                 writer_00,(MkvId)((ulong)in_RSI >> 0x20),(MkvId)in_RSI), bVar2)) {
            if ((in_RDI[2]._vptr_IMkvWriter == (_func_int **)0x0) ||
               (bVar2 = PrimaryChromaticity::Write
                                  ((PrimaryChromaticity *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                   writer_00,(MkvId)((ulong)in_RSI >> 0x20),(MkvId)in_RSI), bVar2))
            {
              if ((in_RDI[3]._vptr_IMkvWriter == (_func_int **)0x0) ||
                 (bVar2 = PrimaryChromaticity::Write
                                    ((PrimaryChromaticity *)
                                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                     writer_00,(MkvId)((ulong)in_RSI >> 0x20),(MkvId)in_RSI), bVar2)
                 ) {
                if ((in_RDI[4]._vptr_IMkvWriter == (_func_int **)0x0) ||
                   (bVar2 = PrimaryChromaticity::Write
                                      ((PrimaryChromaticity *)
                                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                                       ,writer_00,(MkvId)((ulong)in_RSI >> 0x20),(MkvId)in_RSI),
                   bVar2)) {
                  bVar2 = true;
                }
                else {
                  bVar2 = false;
                }
              }
              else {
                bVar2 = false;
              }
            }
            else {
              bVar2 = false;
            }
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool MasteringMetadata::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvMasteringMetadata, size))
    return false;
  if (luminance_max_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvLuminanceMax, luminance_max_)) {
    return false;
  }
  if (luminance_min_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvLuminanceMin, luminance_min_)) {
    return false;
  }
  if (r_ && !r_->Write(writer, libwebm::kMkvPrimaryRChromaticityX,
                       libwebm::kMkvPrimaryRChromaticityY)) {
    return false;
  }
  if (g_ && !g_->Write(writer, libwebm::kMkvPrimaryGChromaticityX,
                       libwebm::kMkvPrimaryGChromaticityY)) {
    return false;
  }
  if (b_ && !b_->Write(writer, libwebm::kMkvPrimaryBChromaticityX,
                       libwebm::kMkvPrimaryBChromaticityY)) {
    return false;
  }
  if (white_point_ &&
      !white_point_->Write(writer, libwebm::kMkvWhitePointChromaticityX,
                           libwebm::kMkvWhitePointChromaticityY)) {
    return false;
  }

  return true;
}